

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactorRK64.cpp
# Opt level: O1

int __thiscall pele::physics::reactions::ReactorRK64::init(ReactorRK64 *this,EVP_PKEY_CTX *ctx)

{
  ParmParse pp;
  string local_88;
  ParmParse local_68;
  
  this->m_reactor_type = (int)ctx;
  if (1 < (int)ctx - 1U) {
    amrex::Abort_host("Wrong reactor type. Choose between 1 (e) or 2 (h).");
  }
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"ode","");
  amrex::ParmParse::ParmParse(&local_68,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  amrex::ParmParse::query
            (&local_68,"verbose",
             &(this->super_Register<pele::physics::reactions::ReactorRK64>).super_ReactorBase.
              verbose,0);
  amrex::ParmParse::query(&local_68,"atol",&this->absTol,0);
  amrex::ParmParse::query(&local_68,"rk64_nsubsteps_guess",&this->rk64_nsubsteps_guess,0);
  amrex::ParmParse::query(&local_68,"rk64_nsubsteps_min",&this->rk64_nsubsteps_min,0);
  amrex::ParmParse::query(&local_68,"rk64_nsubsteps_max",&this->rk64_nsubsteps_max,0);
  amrex::ParmParse::query(&local_68,"clean_init_massfrac",&this->m_clean_init_massfrac,0);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_68);
  return 0;
}

Assistant:

int
ReactorRK64::init(int reactor_type, int /*ncells*/)
{
  BL_PROFILE("Pele::ReactorRK64::init()");
  m_reactor_type = reactor_type;
  ReactorTypes::check_reactor_type(m_reactor_type);
  amrex::ParmParse pp("ode");
  pp.query("verbose", verbose);
  pp.query("atol", absTol);
  pp.query("rk64_nsubsteps_guess", rk64_nsubsteps_guess);
  pp.query("rk64_nsubsteps_min", rk64_nsubsteps_min);
  pp.query("rk64_nsubsteps_max", rk64_nsubsteps_max);
  pp.query("clean_init_massfrac", m_clean_init_massfrac);
  return (0);
}